

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::TextFormat::FieldValuePrinter::PrintFieldName_abi_cxx11_
          (string *__return_storage_ptr__,FieldValuePrinter *this,Message *message,
          Reflection *reflection,FieldDescriptor *field)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringBaseTextGenerator generator;
  StringBaseTextGenerator local_38;
  
  paVar1 = &local_38.output_.field_2;
  local_38.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__StringBaseTextGenerator_01693bc0;
  local_38.output_._M_string_length = 0;
  local_38.output_.field_2._M_local_buf[0] = '\0';
  local_38.output_._M_dataplus._M_p = (pointer)paVar1;
  FastFieldValuePrinter::PrintFieldName
            ((FastFieldValuePrinter *)__return_storage_ptr__,(Message *)this,(Reflection *)message,
             field,&local_38.super_BaseTextGenerator);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.output_._M_dataplus._M_p == paVar1) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_38.output_.field_2._M_allocated_capacity._1_7_,
                  local_38.output_.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_38.output_.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_38.output_._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_38.output_.field_2._M_allocated_capacity._1_7_,
                  local_38.output_.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_38.output_._M_string_length;
  local_38.output_._M_string_length = 0;
  local_38.output_.field_2._M_local_buf[0] = '\0';
  local_38.output_._M_dataplus._M_p = (pointer)paVar1;
  anon_unknown_14::StringBaseTextGenerator::~StringBaseTextGenerator(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormat::FieldValuePrinter::PrintFieldName(
    const Message& message, const Reflection* reflection,
    const FieldDescriptor* field) const {
  FORWARD_IMPL(PrintFieldName, message, reflection, field);
}